

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QMainWindowTabBar * __thiscall
QMainWindowLayout::findTabBar(QMainWindowLayout *this,QDockWidget *dockWidget)

{
  QMainWindowTabBar *this_00;
  ulong uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  QMainWindowTabBar *tabBar;
  
  lVar4 = *(long *)(this + 0x718);
  if (lVar4 == 0) {
    lVar4 = 0;
  }
  else if (**(char **)(lVar4 + 0x20) == -1) {
    uVar1 = 1;
    do {
      uVar5 = uVar1;
      if (*(ulong *)(lVar4 + 0x10) == uVar5) {
        lVar4 = 0;
        uVar5 = 0;
        break;
      }
      uVar1 = uVar5 + 1;
    } while ((*(char **)(lVar4 + 0x20))[(ulong)((uint)uVar5 & 0x7f) + (uVar5 >> 7) * 0x90] == -1);
    goto LAB_0043b53e;
  }
  uVar5 = 0;
LAB_0043b53e:
  if (lVar4 != 0 || uVar5 != 0) {
    do {
      lVar3 = (uVar5 >> 7) * 0x90;
      this_00 = *(QMainWindowTabBar **)
                 (*(long *)(*(long *)(lVar4 + 0x20) + 0x80 + lVar3) +
                 (ulong)*(byte *)((ulong)((uint)uVar5 & 0x7f) + *(long *)(lVar4 + 0x20) + lVar3) * 8
                 );
      bVar2 = QMainWindowTabBar::contains((QMainWindowTabBar *)this_00,dockWidget);
      if (bVar2) {
        return this_00;
      }
      do {
        if (*(long *)(lVar4 + 0x10) - 1U == uVar5) {
          lVar4 = 0;
          uVar5 = 0;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (*(char *)((ulong)((uint)uVar5 & 0x7f) + (uVar5 >> 7) * 0x90 + *(long *)(lVar4 + 0x20)
                        ) == -1);
    } while ((lVar4 != 0) || (uVar5 != 0));
  }
  return (QMainWindowTabBar *)0x0;
}

Assistant:

QMainWindowTabBar *QMainWindowLayout::findTabBar(const QDockWidget *dockWidget) const
{
     for (auto *bar : usedTabBars) {
        Q_ASSERT(qobject_cast<QMainWindowTabBar *>(bar));
        auto *tabBar = static_cast<QMainWindowTabBar *>(bar);
        if (tabBar->contains(dockWidget))
            return tabBar;
    }
    return nullptr;
}